

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::FindEntryWithKey<int>
          (SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
           *this,int *key)

{
  ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *pVVar1;
  uint uVar2;
  long lVar3;
  int iVar5;
  int *piVar4;
  
  piVar4 = (this->buckets).ptr;
  iVar5 = -1;
  if (piVar4 != (int *)0x0) {
    uVar2 = GetBucket(this,*key * 2 + 1);
    pVVar1 = (this->entries).ptr;
    piVar4 = piVar4 + uVar2;
    while( true ) {
      lVar3 = (long)*piVar4;
      iVar5 = -1;
      if ((lVar3 < 0) || (iVar5 = *piVar4, pVVar1[lVar3].super_ValueEntryData<int>.value == *key))
      break;
      piVar4 = &pVVar1[lVar3].super_ValueEntryData<int>.next;
    }
  }
  return iVar5;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key)
        {
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket], last = -1; i >= 0;)
                {
                    TBKey k = this->GetKey(i);
                    if (this->RemoveIfCollected(k, &i, last, targetBucket))
                    {
                        continue;
                    }
                    if (Comparer<TBKey>::Equals(k, key))
                    {
                        return i;
                    }

                    last = i;
                    i = localEntries[i].next;
                }
            }
            return -1;
        }